

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O2

void __thiscall
Js::ScriptContext::RethrowRecordedException
          (ScriptContext *this,HostWrapperCreateFuncType hostWrapperCreateFunc)

{
  JavascriptExceptionObject *exceptionObject;
  bool local_19 [8];
  bool considerPassingToDebugger;
  
  local_19[0] = false;
  exceptionObject = GetAndClearRecordedException(this,local_19);
  if (hostWrapperCreateFunc != (HostWrapperCreateFuncType)0x0) {
    if ((exceptionObject->scriptContext).ptr == this) {
      hostWrapperCreateFunc = (HostWrapperCreateFuncType)(Type)0x0;
    }
    exceptionObject->hostWrapperCreateFunc = (Type)hostWrapperCreateFunc;
  }
  JavascriptExceptionOperators::RethrowExceptionObject(exceptionObject,this,local_19[0]);
}

Assistant:

void ScriptContext::RethrowRecordedException(JavascriptExceptionObject::HostWrapperCreateFuncType hostWrapperCreateFunc)
    {
        bool considerPassingToDebugger = false;
        JavascriptExceptionObject * exceptionObject = this->GetAndClearRecordedException(&considerPassingToDebugger);
        if (hostWrapperCreateFunc)
        {
            exceptionObject->SetHostWrapperCreateFunc(exceptionObject->GetScriptContext() != this ? hostWrapperCreateFunc : nullptr);
        }
        JavascriptExceptionOperators::RethrowExceptionObject(exceptionObject, this, considerPassingToDebugger);
    }